

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cpp
# Opt level: O3

void __thiscall File_Success_Test::~File_Success_Test(File_Success_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(File, Success) {
    std::string fn = inTestDir("floatfile_good.txt");
    EXPECT_TRUE(WriteFile(fn, R"(1
# comment 6632
-2.5
#6502
3e2       -4.75E-1       5.25




6
)"));

    std::vector<float> floats = ReadFloatFile(fn);
    EXPECT_EQ(6, floats.size());
    const float expected[] = {1.f, -2.5f, 300.f, -.475f, 5.25f, 6.f};
    for (int i = 0; i < PBRT_ARRAYSIZE(expected); ++i)
        EXPECT_EQ(expected[i], floats[i]);

    EXPECT_EQ(0, remove(fn.c_str()));
}